

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
construct_value(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *this,value_type *v)

{
  pointer pcVar1;
  
  *(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)this = this + 0x10;
  pcVar1 = (v->_value).asset_path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (v->_value).asset_path_._M_string_length);
  *(storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> **)(this + 0x20) = this + 0x30;
  pcVar1 = (v->_value).resolved_path_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x20),pcVar1,pcVar1 + (v->_value).resolved_path_._M_string_length);
  *(undefined2 *)(this + 0x40) = *(undefined2 *)&v->_has_value;
  std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
  ::vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
            *)(this + 0x48),&(v->_ts)._samples);
  this[0x60] = (storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>)(v->_ts)._dirty;
  return;
}

Assistant:

void construct_value( value_type const & v )
    {
        ::new( value_ptr() ) value_type( v );
    }